

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

uint16_t forwardLutFromBitmap(uint8_t *bitmap,uint16_t *lut)

{
  uint32_t i;
  uint16_t k;
  uint16_t *lut_local;
  uint8_t *bitmap_local;
  
  k = 0;
  for (i = 0; i < 0x10000; i = i + 1) {
    if ((i == 0) || (((uint)bitmap[i >> 3] & 1 << ((byte)i & 7)) != 0)) {
      lut[i] = k;
      k = k + 1;
    }
    else {
      lut[i] = 0;
    }
  }
  return k - 1;
}

Assistant:

static inline uint16_t
forwardLutFromBitmap (const uint8_t* bitmap, uint16_t* lut)
{
    uint16_t k = 0;

    for (uint32_t i = 0; i < USHORT_RANGE; ++i)
    {
        if ((i == 0) || (bitmap[i >> 3] & (1 << (i & 7))))
            lut[i] = k++;
        else
            lut[i] = 0;
    }

    return k - 1;
}